

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Tags.cpp
# Opt level: O0

void __thiscall TagsImp::sanitizeTags(TagsImp *this,string *fmt)

{
  bool bVar1;
  Core *this_00;
  vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_> *this_01;
  reference ppPVar2;
  __sv_type _Var3;
  __sv_type _Var4;
  Plugin **plugin;
  iterator __end1;
  iterator __begin1;
  vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_> *__range1;
  string *fmt_local;
  TagsImp *this_local;
  
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).dateTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_DATE_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).timeTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_TIME_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).rconVersionTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_RCON_VERSION_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).gameVersionTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_GAME_VERSION_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).rulesTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_RULES_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).userTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_USER_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).serverNameTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_SERVER_NAME_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).mapTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_MAP_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).mapGUIDTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_MAP_GUID_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).serverHostnameTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_SERVER_HOSTNAME_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).serverPortTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_SERVER_PORT_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).socketHostnameTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_SOCKET_HOSTNAME_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).socketPortTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_SOCKET_PORT_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).serverPrefixTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_SERVER_PREFIX_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).nameTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_NAME_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).rawNameTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_RAW_NAME_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).ipTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_IP_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).hwidTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_HWID_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).rdnsTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_RDNS_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).steamTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_STEAM_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).uuidTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_UUID_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).idTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_ID_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).characterTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_CHARACTER_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).vehicleTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_VEHICLE_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).adminTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_ADMIN_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).prefixTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_PREFIX_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).gamePrefixTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_GAME_PREFIX_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).teamColorTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_TEAM_COLOR_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).teamShortTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_TEAM_SHORT_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).teamLongTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_TEAM_LONG_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).pingTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_PING_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).scoreTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_SCORE_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).scorePerMinuteTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_SCORE_PER_MINUTE_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).creditsTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_CREDITS_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).killsTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_KILLS_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).deathsTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_DEATHS_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).kdrTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_KDR_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).suicidesTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_SUICIDES_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).headshotsTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_HEADSHOTS_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).headshotKillRatioTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_HEADSHOT_KILL_RATIO_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).vehicleKillsTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_VEHICLE_KILLS_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).buildingKillsTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_BUILDING_KILLS_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).defenceKillsTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_DEFENCE_KILLS_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).gameTimeTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_GAME_TIME_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).gamesTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_GAMES_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).GDIGamesTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_GDI_GAMES_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).NodGamesTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_NOD_GAMES_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).winsTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_WINS_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).GDIWinsTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_GDI_WINS_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).NodWinsTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_NOD_WINS_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).tiesTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_TIES_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).lossesTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_LOSSES_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).GDILossesTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_GDI_LOSSES_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).NodLossesTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_NOD_LOSSES_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).winLossRatioTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_WIN_LOSS_RATIO_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).GDIWinLossRatioTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_GDI_WIN_LOSS_RATIO_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).NodWinLossRatioTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_NOD_WIN_LOSS_RATIO_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).beaconPlacementsTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_BEACON_PLACEMENTS_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).beaconDisarmsTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_BEACON_DISARMS_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).proxyPlacementsTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_PROXY_PLACEMENTS_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).proxyDisarmsTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_PROXY_DISARMS_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).capturesTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_CAPTURES_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).stealsTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_STEALS_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).stolenTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_STOLEN_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).accessTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_ACCESS_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).victimNameTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_VICTIM_NAME_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).victimRawNameTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_VICTIM_RAW_NAME_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).victimIPTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_VICTIM_IP_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).victimHWIDTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_VICTIM_HWID_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).victimRDNSTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_VICTIM_RDNS_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).victimSteamTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_VICTIM_STEAM_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).victimUUIDTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_VICTIM_UUID_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).victimIDTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_VICTIM_ID_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).victimCharacterTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_VICTIM_CHARACTER_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).victimVehicleTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_VICTIM_VEHICLE_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).victimAdminTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_VICTIM_ADMIN_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).victimPrefixTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_VICTIM_PREFIX_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).victimGamePrefixTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_VICTIM_GAME_PREFIX_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).victimTeamColorTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_VICTIM_TEAM_COLOR_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).victimTeamShortTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_VICTIM_TEAM_SHORT_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).victimTeamLongTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_VICTIM_TEAM_LONG_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).victimPingTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_VICTIM_PING_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).victimScoreTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_VICTIM_SCORE_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).victimScorePerMinuteTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_VICTIM_SCORE_PER_MINUTE_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).victimCreditsTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_VICTIM_CREDITS_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).victimKillsTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_VICTIM_KILLS_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).victimDeathsTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_VICTIM_DEATHS_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).victimKDRTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_VICTIM_KDR_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).victimSuicidesTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_VICTIM_SUICIDES_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).victimHeadshotsTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_VICTIM_HEADSHOTS_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).victimHeadshotKillRatioTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_VICTIM_HEADSHOT_KILL_RATIO_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).victimVehicleKillsTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_VICTIM_VEHICLE_KILLS_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).victimBuildingKillsTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_VICTIM_BUILDING_KILLS_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).victimDefenceKillsTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_VICTIM_DEFENCE_KILLS_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).victimGameTimeTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_VICTIM_GAME_TIME_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).victimGamesTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_VICTIM_GAMES_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).victimGDIGamesTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_VICTIM_GDI_GAMES_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).victimNodGamesTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_VICTIM_NOD_GAMES_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).victimWinsTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_VICTIM_WINS_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).victimGDIWinsTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_VICTIM_GDI_WINS_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).victimNodWinsTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_VICTIM_NOD_WINS_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).victimTiesTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_VICTIM_TIES_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).victimLossesTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_VICTIM_LOSSES_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).victimGDILossesTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_VICTIM_GDI_LOSSES_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).victimNodLossesTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_VICTIM_NOD_LOSSES_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).victimWinLossRatioTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_VICTIM_WIN_LOSS_RATIO_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).victimGDIWinLossRatioTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_VICTIM_GDI_WIN_LOSS_RATIO_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).victimNodWinLossRatioTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_VICTIM_NOD_WIN_LOSS_RATIO_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).victimBeaconPlacementsTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_VICTIM_BEACON_PLACEMENTS_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).victimBeaconDisarmsTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_VICTIM_BEACON_DISARMS_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).victimProxyPlacementsTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_VICTIM_PROXY_PLACEMENTS_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).victimProxyDisarmsTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_VICTIM_PROXY_DISARMS_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).victimCapturesTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_VICTIM_CAPTURES_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).victimStealsTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_VICTIM_STEALS_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).victimStolenTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_VICTIM_STOLEN_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).victimAccessTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_VICTIM_ACCESS_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).buildingNameTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_BUILDING_NAME_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).buildingRawNameTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_BUILDING_RAW_NAME_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).buildingHealthTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_BUILDING_HEALTH_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).buildingMaxHealthTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_BUILDING_MAX_HEALTH_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).buildingHealthPercentageTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_BUILDING_HEALTH_PERCENTAGE_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).buildingArmorTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_BUILDING_ARMOR_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).buildingMaxArmorTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_BUILDING_MAX_ARMOR_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).buildingArmorPercentageTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_BUILDING_ARMOR_PERCENTAGE_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).buildingDurabilityTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_BUILDING_DURABILITY_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).buildingMaxDurabilityTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_BUILDING_MAX_DURABILITY_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).buildingDurabilityPercentageTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_BUILDING_DURABILITY_PERCENTAGE_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).buildingTeamColorTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_BUILDING_TEAM_COLOR_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).buildingTeamShortTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_BUILDING_TEAM_SHORT_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).buildingTeamLongTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_BUILDING_TEAM_LONG_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).rankTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_RANK_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).lastGameTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_LAST_GAME_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).GDIScoreTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_GDI_SCORE_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).GDISPMTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_GDI_SPM_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).GDIGameTimeTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_GDI_GAME_TIME_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).GDITiesTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_GDI_TIES_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).GDIBeaconPlacementsTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_GDI_BEACON_PLACEMENTS_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).GDIBeaconDisarmsTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_GDI_BEACON_DISARMS_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).GDIProxyPlacementsTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_GDI_PROXY_PLACEMENTS_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).GDIProxyDisarmsTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_GDI_PROXY_DISARMS_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).GDIKillsTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_GDI_KILLS_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).GDIDeathsTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_GDI_DEATHS_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).GDIVehicleKillsTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_GDI_VEHICLE_KILLS_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).GDIDefenceKillsTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_GDI_DEFENCE_KILLS_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).GDIBuildingKillsTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_GDI_BUILDING_KILLS_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).GDIKDRTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_GDI_KDR_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).GDIHeadshotsTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_GDI_HEADSHOTS_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).GDIHeadshotKillRatioTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_GDI_HEADSHOT_KILL_RATIO_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).NodScoreTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_NOD_SCORE_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).NodSPMTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_NOD_SPM_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).NodGameTimeTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_NOD_GAME_TIME_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).NodTiesTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_NOD_TIES_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).NodBeaconPlacementsTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_NOD_BEACON_PLACEMENTS_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).NodBeaconDisarmsTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_NOD_BEACON_DISARMS_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).NodProxyPlacementsTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_NOD_PROXY_PLACEMENTS_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).NodProxyDisarmsTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_NOD_PROXY_DISARMS_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).NodKillsTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_NOD_KILLS_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).NodDeathsTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_NOD_DEATHS_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).NodVehicleKillsTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_NOD_VEHICLE_KILLS_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).NodDefenceKillsTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_NOD_DEFENCE_KILLS_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).NodBuildingKillsTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_NOD_BUILDING_KILLS_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).NodKDRTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_NOD_KDR_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).NodHeadshotsTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_NOD_HEADSHOTS_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).NodHeadshotKillRatioTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_NOD_HEADSHOT_KILL_RATIO_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).weaponTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_WEAPON_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).objectTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_OBJECT_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).messageTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_MESSAGE_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).newNameTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_NEW_NAME_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).winScoreTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_WIN_SCORE_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).loseScoreTag);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)&(this->super_Tags).INTERNAL_LOSE_SCORE_TAG);
  RenX::replace_tag(fmt,_Var3,_Var4);
  this_00 = RenX::getCore();
  this_01 = RenX::Core::getPlugins(this_00);
  __end1 = std::vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_>::begin(this_01);
  plugin = (Plugin **)std::vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_>::end(this_01);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<RenX::Plugin_**,_std::vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_>_>
                      (&__end1,(__normal_iterator<RenX::Plugin_**,_std::vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_>_>
                                *)&plugin);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppPVar2 = __gnu_cxx::
              __normal_iterator<RenX::Plugin_**,_std::vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_>_>
              ::operator*(&__end1);
    (**(code **)(*(long *)*ppPVar2 + 0xe0))(*ppPVar2,fmt);
    __gnu_cxx::
    __normal_iterator<RenX::Plugin_**,_std::vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void TagsImp::sanitizeTags(std::string& fmt)
{
	/** Global tags */
	RenX::replace_tag(fmt, this->dateTag, this->INTERNAL_DATE_TAG);
	RenX::replace_tag(fmt, this->timeTag, this->INTERNAL_TIME_TAG);

	/** Server tags */
	RenX::replace_tag(fmt, this->rconVersionTag, this->INTERNAL_RCON_VERSION_TAG);
	RenX::replace_tag(fmt, this->gameVersionTag, this->INTERNAL_GAME_VERSION_TAG);
	RenX::replace_tag(fmt, this->rulesTag, this->INTERNAL_RULES_TAG);
	RenX::replace_tag(fmt, this->userTag, this->INTERNAL_USER_TAG);
	RenX::replace_tag(fmt, this->serverNameTag, this->INTERNAL_SERVER_NAME_TAG);
	RenX::replace_tag(fmt, this->mapTag, this->INTERNAL_MAP_TAG);
	RenX::replace_tag(fmt, this->mapGUIDTag, this->INTERNAL_MAP_GUID_TAG);
	RenX::replace_tag(fmt, this->serverHostnameTag, this->INTERNAL_SERVER_HOSTNAME_TAG);
	RenX::replace_tag(fmt, this->serverPortTag, this->INTERNAL_SERVER_PORT_TAG);
	RenX::replace_tag(fmt, this->socketHostnameTag, this->INTERNAL_SOCKET_HOSTNAME_TAG);
	RenX::replace_tag(fmt, this->socketPortTag, this->INTERNAL_SOCKET_PORT_TAG);
	RenX::replace_tag(fmt, this->serverPrefixTag, this->INTERNAL_SERVER_PREFIX_TAG);

	/** Player tags */
	RenX::replace_tag(fmt, this->nameTag, this->INTERNAL_NAME_TAG);
	RenX::replace_tag(fmt, this->rawNameTag, this->INTERNAL_RAW_NAME_TAG);
	RenX::replace_tag(fmt, this->ipTag, this->INTERNAL_IP_TAG);
	RenX::replace_tag(fmt, this->hwidTag, this->INTERNAL_HWID_TAG);
	RenX::replace_tag(fmt, this->rdnsTag, this->INTERNAL_RDNS_TAG);
	RenX::replace_tag(fmt, this->steamTag, this->INTERNAL_STEAM_TAG);
	RenX::replace_tag(fmt, this->uuidTag, this->INTERNAL_UUID_TAG);
	RenX::replace_tag(fmt, this->idTag, this->INTERNAL_ID_TAG);
	RenX::replace_tag(fmt, this->characterTag, this->INTERNAL_CHARACTER_TAG);
	RenX::replace_tag(fmt, this->vehicleTag, this->INTERNAL_VEHICLE_TAG);
	RenX::replace_tag(fmt, this->adminTag, this->INTERNAL_ADMIN_TAG);
	RenX::replace_tag(fmt, this->prefixTag, this->INTERNAL_PREFIX_TAG);
	RenX::replace_tag(fmt, this->gamePrefixTag, this->INTERNAL_GAME_PREFIX_TAG);
	RenX::replace_tag(fmt, this->teamColorTag, this->INTERNAL_TEAM_COLOR_TAG);
	RenX::replace_tag(fmt, this->teamShortTag, this->INTERNAL_TEAM_SHORT_TAG);
	RenX::replace_tag(fmt, this->teamLongTag, this->INTERNAL_TEAM_LONG_TAG);
	RenX::replace_tag(fmt, this->pingTag, this->INTERNAL_PING_TAG);
	RenX::replace_tag(fmt, this->scoreTag, this->INTERNAL_SCORE_TAG);
	RenX::replace_tag(fmt, this->scorePerMinuteTag, this->INTERNAL_SCORE_PER_MINUTE_TAG);
	RenX::replace_tag(fmt, this->creditsTag, this->INTERNAL_CREDITS_TAG);
	RenX::replace_tag(fmt, this->killsTag, this->INTERNAL_KILLS_TAG);
	RenX::replace_tag(fmt, this->deathsTag, this->INTERNAL_DEATHS_TAG);
	RenX::replace_tag(fmt, this->kdrTag, this->INTERNAL_KDR_TAG);
	RenX::replace_tag(fmt, this->suicidesTag, this->INTERNAL_SUICIDES_TAG);
	RenX::replace_tag(fmt, this->headshotsTag, this->INTERNAL_HEADSHOTS_TAG);
	RenX::replace_tag(fmt, this->headshotKillRatioTag, this->INTERNAL_HEADSHOT_KILL_RATIO_TAG);
	RenX::replace_tag(fmt, this->vehicleKillsTag, this->INTERNAL_VEHICLE_KILLS_TAG);
	RenX::replace_tag(fmt, this->buildingKillsTag, this->INTERNAL_BUILDING_KILLS_TAG);
	RenX::replace_tag(fmt, this->defenceKillsTag, this->INTERNAL_DEFENCE_KILLS_TAG);
	RenX::replace_tag(fmt, this->gameTimeTag, this->INTERNAL_GAME_TIME_TAG);
	RenX::replace_tag(fmt, this->gamesTag, this->INTERNAL_GAMES_TAG);
	RenX::replace_tag(fmt, this->GDIGamesTag, this->INTERNAL_GDI_GAMES_TAG);
	RenX::replace_tag(fmt, this->NodGamesTag, this->INTERNAL_NOD_GAMES_TAG);
	RenX::replace_tag(fmt, this->winsTag, this->INTERNAL_WINS_TAG);
	RenX::replace_tag(fmt, this->GDIWinsTag, this->INTERNAL_GDI_WINS_TAG);
	RenX::replace_tag(fmt, this->NodWinsTag, this->INTERNAL_NOD_WINS_TAG);
	RenX::replace_tag(fmt, this->tiesTag, this->INTERNAL_TIES_TAG);
	RenX::replace_tag(fmt, this->lossesTag, this->INTERNAL_LOSSES_TAG);
	RenX::replace_tag(fmt, this->GDILossesTag, this->INTERNAL_GDI_LOSSES_TAG);
	RenX::replace_tag(fmt, this->NodLossesTag, this->INTERNAL_NOD_LOSSES_TAG);
	RenX::replace_tag(fmt, this->winLossRatioTag, this->INTERNAL_WIN_LOSS_RATIO_TAG);
	RenX::replace_tag(fmt, this->GDIWinLossRatioTag, this->INTERNAL_GDI_WIN_LOSS_RATIO_TAG);
	RenX::replace_tag(fmt, this->NodWinLossRatioTag, this->INTERNAL_NOD_WIN_LOSS_RATIO_TAG);
	RenX::replace_tag(fmt, this->beaconPlacementsTag, this->INTERNAL_BEACON_PLACEMENTS_TAG);
	RenX::replace_tag(fmt, this->beaconDisarmsTag, this->INTERNAL_BEACON_DISARMS_TAG);
	RenX::replace_tag(fmt, this->proxyPlacementsTag, this->INTERNAL_PROXY_PLACEMENTS_TAG);
	RenX::replace_tag(fmt, this->proxyDisarmsTag, this->INTERNAL_PROXY_DISARMS_TAG);
	RenX::replace_tag(fmt, this->capturesTag, this->INTERNAL_CAPTURES_TAG);
	RenX::replace_tag(fmt, this->stealsTag, this->INTERNAL_STEALS_TAG);
	RenX::replace_tag(fmt, this->stolenTag, this->INTERNAL_STOLEN_TAG);
	RenX::replace_tag(fmt, this->accessTag, this->INTERNAL_ACCESS_TAG);

	/** Victim tags */
	RenX::replace_tag(fmt, this->victimNameTag, this->INTERNAL_VICTIM_NAME_TAG);
	RenX::replace_tag(fmt, this->victimRawNameTag, this->INTERNAL_VICTIM_RAW_NAME_TAG);
	RenX::replace_tag(fmt, this->victimIPTag, this->INTERNAL_VICTIM_IP_TAG);
	RenX::replace_tag(fmt, this->victimHWIDTag, this->INTERNAL_VICTIM_HWID_TAG);
	RenX::replace_tag(fmt, this->victimRDNSTag, this->INTERNAL_VICTIM_RDNS_TAG);
	RenX::replace_tag(fmt, this->victimSteamTag, this->INTERNAL_VICTIM_STEAM_TAG);
	RenX::replace_tag(fmt, this->victimUUIDTag, this->INTERNAL_VICTIM_UUID_TAG);
	RenX::replace_tag(fmt, this->victimIDTag, this->INTERNAL_VICTIM_ID_TAG);
	RenX::replace_tag(fmt, this->victimCharacterTag, this->INTERNAL_VICTIM_CHARACTER_TAG);
	RenX::replace_tag(fmt, this->victimVehicleTag, this->INTERNAL_VICTIM_VEHICLE_TAG);
	RenX::replace_tag(fmt, this->victimAdminTag, this->INTERNAL_VICTIM_ADMIN_TAG);
	RenX::replace_tag(fmt, this->victimPrefixTag, this->INTERNAL_VICTIM_PREFIX_TAG);
	RenX::replace_tag(fmt, this->victimGamePrefixTag, this->INTERNAL_VICTIM_GAME_PREFIX_TAG);
	RenX::replace_tag(fmt, this->victimTeamColorTag, this->INTERNAL_VICTIM_TEAM_COLOR_TAG);
	RenX::replace_tag(fmt, this->victimTeamShortTag, this->INTERNAL_VICTIM_TEAM_SHORT_TAG);
	RenX::replace_tag(fmt, this->victimTeamLongTag, this->INTERNAL_VICTIM_TEAM_LONG_TAG);
	RenX::replace_tag(fmt, this->victimPingTag, this->INTERNAL_VICTIM_PING_TAG);
	RenX::replace_tag(fmt, this->victimScoreTag, this->INTERNAL_VICTIM_SCORE_TAG);
	RenX::replace_tag(fmt, this->victimScorePerMinuteTag, this->INTERNAL_VICTIM_SCORE_PER_MINUTE_TAG);
	RenX::replace_tag(fmt, this->victimCreditsTag, this->INTERNAL_VICTIM_CREDITS_TAG);
	RenX::replace_tag(fmt, this->victimKillsTag, this->INTERNAL_VICTIM_KILLS_TAG);
	RenX::replace_tag(fmt, this->victimDeathsTag, this->INTERNAL_VICTIM_DEATHS_TAG);
	RenX::replace_tag(fmt, this->victimKDRTag, this->INTERNAL_VICTIM_KDR_TAG);
	RenX::replace_tag(fmt, this->victimSuicidesTag, this->INTERNAL_VICTIM_SUICIDES_TAG);
	RenX::replace_tag(fmt, this->victimHeadshotsTag, this->INTERNAL_VICTIM_HEADSHOTS_TAG);
	RenX::replace_tag(fmt, this->victimHeadshotKillRatioTag, this->INTERNAL_VICTIM_HEADSHOT_KILL_RATIO_TAG);
	RenX::replace_tag(fmt, this->victimVehicleKillsTag, this->INTERNAL_VICTIM_VEHICLE_KILLS_TAG);
	RenX::replace_tag(fmt, this->victimBuildingKillsTag, this->INTERNAL_VICTIM_BUILDING_KILLS_TAG);
	RenX::replace_tag(fmt, this->victimDefenceKillsTag, this->INTERNAL_VICTIM_DEFENCE_KILLS_TAG);
	RenX::replace_tag(fmt, this->victimGameTimeTag, this->INTERNAL_VICTIM_GAME_TIME_TAG);
	RenX::replace_tag(fmt, this->victimGamesTag, this->INTERNAL_VICTIM_GAMES_TAG);
	RenX::replace_tag(fmt, this->victimGDIGamesTag, this->INTERNAL_VICTIM_GDI_GAMES_TAG);
	RenX::replace_tag(fmt, this->victimNodGamesTag, this->INTERNAL_VICTIM_NOD_GAMES_TAG);
	RenX::replace_tag(fmt, this->victimWinsTag, this->INTERNAL_VICTIM_WINS_TAG);
	RenX::replace_tag(fmt, this->victimGDIWinsTag, this->INTERNAL_VICTIM_GDI_WINS_TAG);
	RenX::replace_tag(fmt, this->victimNodWinsTag, this->INTERNAL_VICTIM_NOD_WINS_TAG);
	RenX::replace_tag(fmt, this->victimTiesTag, this->INTERNAL_VICTIM_TIES_TAG);
	RenX::replace_tag(fmt, this->victimLossesTag, this->INTERNAL_VICTIM_LOSSES_TAG);
	RenX::replace_tag(fmt, this->victimGDILossesTag, this->INTERNAL_VICTIM_GDI_LOSSES_TAG);
	RenX::replace_tag(fmt, this->victimNodLossesTag, this->INTERNAL_VICTIM_NOD_LOSSES_TAG);
	RenX::replace_tag(fmt, this->victimWinLossRatioTag, this->INTERNAL_VICTIM_WIN_LOSS_RATIO_TAG);
	RenX::replace_tag(fmt, this->victimGDIWinLossRatioTag, this->INTERNAL_VICTIM_GDI_WIN_LOSS_RATIO_TAG);
	RenX::replace_tag(fmt, this->victimNodWinLossRatioTag, this->INTERNAL_VICTIM_NOD_WIN_LOSS_RATIO_TAG);
	RenX::replace_tag(fmt, this->victimBeaconPlacementsTag, this->INTERNAL_VICTIM_BEACON_PLACEMENTS_TAG);
	RenX::replace_tag(fmt, this->victimBeaconDisarmsTag, this->INTERNAL_VICTIM_BEACON_DISARMS_TAG);
	RenX::replace_tag(fmt, this->victimProxyPlacementsTag, this->INTERNAL_VICTIM_PROXY_PLACEMENTS_TAG);
	RenX::replace_tag(fmt, this->victimProxyDisarmsTag, this->INTERNAL_VICTIM_PROXY_DISARMS_TAG);
	RenX::replace_tag(fmt, this->victimCapturesTag, this->INTERNAL_VICTIM_CAPTURES_TAG);
	RenX::replace_tag(fmt, this->victimStealsTag, this->INTERNAL_VICTIM_STEALS_TAG);
	RenX::replace_tag(fmt, this->victimStolenTag, this->INTERNAL_VICTIM_STOLEN_TAG);
	RenX::replace_tag(fmt, this->victimAccessTag, this->INTERNAL_VICTIM_ACCESS_TAG);

	/** Building tags */
	RenX::replace_tag(fmt, this->buildingNameTag, this->INTERNAL_BUILDING_NAME_TAG);
	RenX::replace_tag(fmt, this->buildingRawNameTag, this->INTERNAL_BUILDING_RAW_NAME_TAG);
	RenX::replace_tag(fmt, this->buildingHealthTag, this->INTERNAL_BUILDING_HEALTH_TAG);
	RenX::replace_tag(fmt, this->buildingMaxHealthTag, this->INTERNAL_BUILDING_MAX_HEALTH_TAG);
	RenX::replace_tag(fmt, this->buildingHealthPercentageTag, this->INTERNAL_BUILDING_HEALTH_PERCENTAGE_TAG);
	RenX::replace_tag(fmt, this->buildingArmorTag, this->INTERNAL_BUILDING_ARMOR_TAG);
	RenX::replace_tag(fmt, this->buildingMaxArmorTag, this->INTERNAL_BUILDING_MAX_ARMOR_TAG);
	RenX::replace_tag(fmt, this->buildingArmorPercentageTag, this->INTERNAL_BUILDING_ARMOR_PERCENTAGE_TAG);
	RenX::replace_tag(fmt, this->buildingDurabilityTag, this->INTERNAL_BUILDING_DURABILITY_TAG);
	RenX::replace_tag(fmt, this->buildingMaxDurabilityTag, this->INTERNAL_BUILDING_MAX_DURABILITY_TAG);
	RenX::replace_tag(fmt, this->buildingDurabilityPercentageTag, this->INTERNAL_BUILDING_DURABILITY_PERCENTAGE_TAG);
	RenX::replace_tag(fmt, this->buildingTeamColorTag, this->INTERNAL_BUILDING_TEAM_COLOR_TAG);
	RenX::replace_tag(fmt, this->buildingTeamShortTag, this->INTERNAL_BUILDING_TEAM_SHORT_TAG);
	RenX::replace_tag(fmt, this->buildingTeamLongTag, this->INTERNAL_BUILDING_TEAM_LONG_TAG);

	/** Ladder tags */
	RenX::replace_tag(fmt, this->rankTag, this->INTERNAL_RANK_TAG);
	RenX::replace_tag(fmt, this->lastGameTag, this->INTERNAL_LAST_GAME_TAG);
	RenX::replace_tag(fmt, this->GDIScoreTag, this->INTERNAL_GDI_SCORE_TAG);
	RenX::replace_tag(fmt, this->GDISPMTag, this->INTERNAL_GDI_SPM_TAG);
	RenX::replace_tag(fmt, this->GDIGameTimeTag, this->INTERNAL_GDI_GAME_TIME_TAG);
	RenX::replace_tag(fmt, this->GDITiesTag, this->INTERNAL_GDI_TIES_TAG);
	RenX::replace_tag(fmt, this->GDIBeaconPlacementsTag, this->INTERNAL_GDI_BEACON_PLACEMENTS_TAG);
	RenX::replace_tag(fmt, this->GDIBeaconDisarmsTag, this->INTERNAL_GDI_BEACON_DISARMS_TAG);
	RenX::replace_tag(fmt, this->GDIProxyPlacementsTag, this->INTERNAL_GDI_PROXY_PLACEMENTS_TAG);
	RenX::replace_tag(fmt, this->GDIProxyDisarmsTag, this->INTERNAL_GDI_PROXY_DISARMS_TAG);
	RenX::replace_tag(fmt, this->GDIKillsTag, this->INTERNAL_GDI_KILLS_TAG);
	RenX::replace_tag(fmt, this->GDIDeathsTag, this->INTERNAL_GDI_DEATHS_TAG);
	RenX::replace_tag(fmt, this->GDIVehicleKillsTag, this->INTERNAL_GDI_VEHICLE_KILLS_TAG);
	RenX::replace_tag(fmt, this->GDIDefenceKillsTag, this->INTERNAL_GDI_DEFENCE_KILLS_TAG);
	RenX::replace_tag(fmt, this->GDIBuildingKillsTag, this->INTERNAL_GDI_BUILDING_KILLS_TAG);
	RenX::replace_tag(fmt, this->GDIKDRTag, this->INTERNAL_GDI_KDR_TAG);
	RenX::replace_tag(fmt, this->GDIHeadshotsTag, this->INTERNAL_GDI_HEADSHOTS_TAG);
	RenX::replace_tag(fmt, this->GDIHeadshotKillRatioTag, this->INTERNAL_GDI_HEADSHOT_KILL_RATIO_TAG);
	RenX::replace_tag(fmt, this->NodScoreTag, this->INTERNAL_NOD_SCORE_TAG);
	RenX::replace_tag(fmt, this->NodSPMTag, this->INTERNAL_NOD_SPM_TAG);
	RenX::replace_tag(fmt, this->NodGameTimeTag, this->INTERNAL_NOD_GAME_TIME_TAG);
	RenX::replace_tag(fmt, this->NodTiesTag, this->INTERNAL_NOD_TIES_TAG);
	RenX::replace_tag(fmt, this->NodBeaconPlacementsTag, this->INTERNAL_NOD_BEACON_PLACEMENTS_TAG);
	RenX::replace_tag(fmt, this->NodBeaconDisarmsTag, this->INTERNAL_NOD_BEACON_DISARMS_TAG);
	RenX::replace_tag(fmt, this->NodProxyPlacementsTag, this->INTERNAL_NOD_PROXY_PLACEMENTS_TAG);
	RenX::replace_tag(fmt, this->NodProxyDisarmsTag, this->INTERNAL_NOD_PROXY_DISARMS_TAG);
	RenX::replace_tag(fmt, this->NodKillsTag, this->INTERNAL_NOD_KILLS_TAG);
	RenX::replace_tag(fmt, this->NodDeathsTag, this->INTERNAL_NOD_DEATHS_TAG);
	RenX::replace_tag(fmt, this->NodVehicleKillsTag, this->INTERNAL_NOD_VEHICLE_KILLS_TAG);
	RenX::replace_tag(fmt, this->NodDefenceKillsTag, this->INTERNAL_NOD_DEFENCE_KILLS_TAG);
	RenX::replace_tag(fmt, this->NodBuildingKillsTag, this->INTERNAL_NOD_BUILDING_KILLS_TAG);
	RenX::replace_tag(fmt, this->NodKDRTag, this->INTERNAL_NOD_KDR_TAG);
	RenX::replace_tag(fmt, this->NodHeadshotsTag, this->INTERNAL_NOD_HEADSHOTS_TAG);
	RenX::replace_tag(fmt, this->NodHeadshotKillRatioTag, this->INTERNAL_NOD_HEADSHOT_KILL_RATIO_TAG);

	/** Other tags */
	RenX::replace_tag(fmt, this->weaponTag, this->INTERNAL_WEAPON_TAG);
	RenX::replace_tag(fmt, this->objectTag, this->INTERNAL_OBJECT_TAG);
	RenX::replace_tag(fmt, this->messageTag, this->INTERNAL_MESSAGE_TAG);
	RenX::replace_tag(fmt, this->newNameTag, this->INTERNAL_NEW_NAME_TAG);
	RenX::replace_tag(fmt, this->winScoreTag, this->INTERNAL_WIN_SCORE_TAG);
	RenX::replace_tag(fmt, this->loseScoreTag, this->INTERNAL_LOSE_SCORE_TAG);

	for (const auto& plugin : RenX::getCore()->getPlugins()) {
		plugin->RenX_SanitizeTags(fmt);
	}
}